

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O3

int compare_list(char **name,void **l,zip_uint64_t *n,int size,_func_int_void_ptr_void_ptr *cmp,
                _func_int_char_ptr_ptr_void_ptr_void_ptr *check,_func_void_void_ptr *print)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void **ppvVar5;
  int iVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  long lVar11;
  uint uVar12;
  uint local_44;
  _func_int_char_ptr_ptr_void_ptr_void_ptr *local_40;
  uint local_34;
  
  if (*n == 0) {
    uVar8 = 0;
    uVar12 = 0;
    uVar4 = 0;
  }
  else {
    local_40 = check;
    uVar4 = 0;
    uVar12 = 0;
    uVar9 = 0;
    do {
      uVar8 = (uint)uVar9;
      if (n[1] <= uVar9) break;
      iVar2 = (*cmp)(*l,l[1]);
      if (iVar2 == 0) {
        if (local_40 != (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0) {
          uVar3 = (*local_40)(name,*l,l[1]);
          uVar4 = uVar4 | uVar3;
        }
        *l = (void *)((long)*l + (ulong)(uint)size);
        uVar12 = uVar12 + 1;
LAB_0010302d:
        uVar9 = (ulong)(uVar8 + 1);
        ppvVar5 = l + 1;
      }
      else {
        if (-1 < iVar2) {
          if (verbose != 0 && header_done == 0) {
            printf("--- %s\n+++ %s\n",*name,name[1]);
            header_done = 1;
          }
          if (verbose != 0) {
            printf("%c ",0x2b);
            (*print)(l[1]);
          }
          uVar4 = 1;
          goto LAB_0010302d;
        }
        if (verbose != 0 && header_done == 0) {
          printf("--- %s\n+++ %s\n",*name,name[1]);
          header_done = 1;
        }
        if (verbose != 0) {
          printf("%c ",0x2d);
          (*print)(*l);
        }
        uVar12 = uVar12 + 1;
        uVar4 = 1;
        ppvVar5 = l;
      }
      uVar8 = (uint)uVar9;
      *ppvVar5 = (void *)((long)*ppvVar5 + (ulong)(uint)size);
    } while ((ulong)uVar12 < *n);
  }
  local_34 = uVar12;
  local_44 = uVar8;
  uVar8 = 0x2d;
  lVar11 = 0;
  puVar10 = &local_34;
  bVar1 = true;
  do {
    bVar7 = bVar1;
    uVar12 = *puVar10;
    uVar9 = (ulong)uVar12;
    iVar2 = header_done;
    iVar6 = verbose;
    if (uVar9 < n[lVar11]) {
      do {
        if (iVar6 != 0 && iVar2 == 0) {
          printf("--- %s\n+++ %s\n",*name,name[1]);
          header_done = 1;
          iVar2 = 1;
          iVar6 = verbose;
        }
        if (iVar6 == 0) {
          iVar6 = 0;
        }
        else {
          printf("%c ",(ulong)uVar8);
          (*print)(l[lVar11]);
          iVar2 = header_done;
          iVar6 = verbose;
        }
        l[lVar11] = (void *)((long)l[lVar11] + (ulong)(uint)size);
        uVar12 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar12;
      } while (uVar9 < n[lVar11]);
      uVar4 = 1;
    }
    *puVar10 = uVar12;
    lVar11 = 1;
    uVar8 = 0x2b;
    puVar10 = &local_44;
    bVar1 = false;
  } while (bVar7);
  return uVar4;
}

Assistant:

static int
compare_list(char *const name[2], const void *l[2], const zip_uint64_t n[2], int size, int (*cmp)(const void *, const void *), int (*check)(char *const name[2], const void *, const void *), void (*print)(const void *)) {
    unsigned int i[2];
    int j, c;
    int diff;

#define INC(k) (i[k]++, l[k] = ((const char *)l[k]) + size)
#define PRINT(k)                                          \
    do {                                                  \
	if (header_done == 0 && verbose) {                \
	    printf("--- %s\n+++ %s\n", name[0], name[1]); \
	    header_done = 1;                              \
	}                                                 \
	if (verbose) {                                    \
	    printf("%c ", (k) ? '+' : '-');               \
	    print(l[k]);                                  \
	}                                                 \
	diff = 1;                                         \
    } while (0)

    i[0] = i[1] = 0;
    diff = 0;
    while (i[0] < n[0] && i[1] < n[1]) {
	c = cmp(l[0], l[1]);

	if (c == 0) {
	    if (check)
		diff |= check(name, l[0], l[1]);
	    INC(0);
	    INC(1);
	}
	else if (c < 0) {
	    PRINT(0);
	    INC(0);
	}
	else {
	    PRINT(1);
	    INC(1);
	}
    }

    for (j = 0; j < 2; j++) {
	while (i[j] < n[j]) {
	    PRINT(j);
	    INC(j);
	}
    }

    return diff;
}